

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

TiffImageInfo * __thiscall
TIFFImageHandler::ReadImageInfo
          (TiffImageInfo *__return_storage_ptr__,TIFFImageHandler *this,
          IByteReaderWithPosition *inTIFFStream,unsigned_long inImageIndex)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TIFF *tif;
  Trace *pTVar4;
  undefined8 uVar5;
  IByteReaderWithPosition *local_48;
  StreamWithPos streamInfo;
  EStatusCode status;
  TIFF *input;
  unsigned_long inImageIndex_local;
  IByteReaderWithPosition *inTIFFStream_local;
  TIFFImageHandler *this_local;
  
  TiffImageInfo::TiffImageInfo(__return_storage_ptr__);
  (__return_storage_ptr__->dimensions).first = -1.0;
  (__return_storage_ptr__->dimensions).second = -1.0;
  __return_storage_ptr__->colorComponents = 0;
  TIFFSetErrorHandler(ReportError);
  TIFFSetWarningHandler(ReportWarning);
  local_48 = inTIFFStream;
  iVar3 = (*(inTIFFStream->super_IByteReader)._vptr_IByteReader[6])();
  streamInfo.mStream = (IByteReaderWithPosition *)CONCAT44(extraout_var,iVar3);
  tif = TIFFClientOpen("Stream","r",&local_48,STATIC_streamRead,STATIC_streamWrite,STATIC_streamSeek
                       ,STATIC_streamClose,STATIC_tiffSize,STATIC_tiffMap,STATIC_tiffUnmap);
  if (tif == (TIFF *)0x0) {
    pTVar4 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar4,"TIFFImageHandler::ReadImageDimensions. cannot open stream for reading"
                     );
  }
  else {
    InitializeConversionState(this);
    this->mT2p->input = tif;
    std::__cxx11::string::operator=((string *)&this->mT2p->inputFilePath,"");
    this->mT2p->pdf_page = (tdir_t)inImageIndex;
    streamInfo.mOriginalPosition._4_4_ = ReadTopLevelTiffInformation(this);
    if (streamInfo.mOriginalPosition._4_4_ == eSuccess) {
      if (this->mT2p->pdf_page < this->mT2p->tiff_pagecount) {
        streamInfo.mOriginalPosition._4_4_ = ReadTIFFPageInformation(this);
        if (streamInfo.mOriginalPosition._4_4_ == eSuccess) {
          (__return_storage_ptr__->dimensions).first =
               (double)((this->mT2p->pdf_mediabox).x2 - (this->mT2p->pdf_mediabox).x1);
          (__return_storage_ptr__->dimensions).second =
               (double)((this->mT2p->pdf_mediabox).y2 - (this->mT2p->pdf_mediabox).y1);
          __return_storage_ptr__->colorComponents = (uint)this->mT2p->tiff_samplesperpixel;
        }
      }
      else {
        pTVar4 = Trace::DefaultTrace();
        uVar1 = this->mT2p->pdf_page;
        uVar2 = this->mT2p->tiff_pagecount;
        uVar5 = std::__cxx11::string::c_str();
        Trace::TraceToLog(pTVar4,
                          "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s"
                          ,(ulong)uVar1,(ulong)uVar2,uVar5);
        streamInfo.mOriginalPosition._4_4_ = eFailure;
      }
    }
  }
  DestroyConversionState(this);
  if (tif != (TIFF *)0x0) {
    TIFFClose(tif);
  }
  return __return_storage_ptr__;
}

Assistant:

TIFFImageHandler::TiffImageInfo TIFFImageHandler::ReadImageInfo(IByteReaderWithPosition* inTIFFStream,unsigned long inImageIndex)
{
	TIFF* input = NULL;
    TiffImageInfo imageInfo;
	
	imageInfo.dimensions.first = -1;
	imageInfo.dimensions.second = -1;
	imageInfo.colorComponents = 0;
    EStatusCode status;
    
	do
	{
		TIFFSetErrorHandler(ReportError);
		TIFFSetWarningHandler(ReportWarning);
        
		StreamWithPos streamInfo;
		streamInfo.mStream = inTIFFStream;
		streamInfo.mOriginalPosition = inTIFFStream->GetCurrentPosition();
		
		input = TIFFClientOpen("Stream","r",(thandle_t)&streamInfo,STATIC_streamRead,
                               STATIC_streamWrite,
                               STATIC_streamSeek,
                               STATIC_streamClose,
                               STATIC_tiffSize,
                               STATIC_tiffMap,
                               STATIC_tiffUnmap);
		if(!input)
		{
			TRACE_LOG("TIFFImageHandler::ReadImageDimensions. cannot open stream for reading");
			break;
		}
        
        
		InitializeConversionState();
		mT2p->input = input;
		mT2p->inputFilePath = "";
		mT2p->pdf_page = (tdir_t)inImageIndex;
        
        
        status = ReadTopLevelTiffInformation();
        if(status != PDFHummus::eSuccess)
            break;
            
        if(mT2p->pdf_page >= mT2p->tiff_pagecount)
        {
            TRACE_LOG3(
                           "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s",
                           mT2p->pdf_page,
                           mT2p->tiff_pagecount,
                           mT2p->inputFilePath.c_str());
            status = PDFHummus::eFailure;
            break;
        }
        
        status = ReadTIFFPageInformation();
        if(status != PDFHummus::eSuccess)
            break;
        imageInfo.dimensions.first = mT2p->pdf_mediabox.x2 - mT2p->pdf_mediabox.x1;
        imageInfo.dimensions.second = mT2p->pdf_mediabox.y2 - mT2p->pdf_mediabox.y1;
		imageInfo.colorComponents = mT2p->tiff_samplesperpixel;
		      
	}while(false);
    
	DestroyConversionState();
	if(input != NULL)
		TIFFClose(input);
    
    return imageInfo;
}